

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_carith.c
# Opt level: O0

int lj_carith_op(lua_State *L,MMS mm)

{
  int iVar1;
  CDArith *in_RDI;
  CDArith ca;
  CTState *cts;
  CTState *cts_1;
  MMS in_stack_ffffffffffffffd4;
  CDArith *in_stack_ffffffffffffffd8;
  CTState *in_stack_ffffffffffffffe0;
  lua_State *in_stack_ffffffffffffffe8;
  
  *(CDArith **)((ulong)*(uint *)((ulong)*(uint *)(in_RDI->p + 1) + 0xfc) + 0x10) = in_RDI;
  iVar1 = carith_checkarg((lua_State *)ca.p[1],(CTState *)CONCAT44(ca.p[0]._4_4_,ca.p[0]._0_4_),
                          in_RDI);
  if ((iVar1 == 0) ||
     ((iVar1 = carith_int64(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,
                            in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4), iVar1 == 0 &&
      (iVar1 = carith_ptr(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,
                          in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4), iVar1 == 0)))) {
    iVar1 = lj_carith_meta((lua_State *)ca.ct[1],(CTState *)ca.ct[0],(CDArith *)ca.p[1],
                           ca.p[0]._4_4_);
  }
  else {
    *(undefined8 *)((ulong)*(uint *)(in_RDI->p + 1) + 0xa8) = *(undefined8 *)&in_RDI->ct[1][-1].sib;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int lj_carith_op(lua_State *L, MMS mm)
{
  CTState *cts = ctype_cts(L);
  CDArith ca;
  if (carith_checkarg(L, cts, &ca)) {
    if (carith_int64(L, cts, &ca, mm) || carith_ptr(L, cts, &ca, mm)) {
      copyTV(L, &G(L)->tmptv2, L->top-1);  /* Remember for trace recorder. */
      return 1;
    }
  }
  return lj_carith_meta(L, cts, &ca, mm);
}